

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highscore.h
# Opt level: O0

void __thiscall Highscore::Set(Highscore *this,size_t id,size_t score)

{
  __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
  _Var1;
  bool bVar2;
  pointer pEVar3;
  iterator __first;
  iterator __last;
  __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
  local_78;
  __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
  local_70;
  Entry *local_68;
  Entry *local_60;
  __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
  local_58;
  Entry *local_50;
  __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
  local_48;
  size_t local_40;
  Entry *local_38;
  __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
  local_30;
  __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
  local_28;
  __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
  it;
  size_t score_local;
  size_t id_local;
  Highscore *this_local;
  
  if (this->mLowestScore <= score) {
    it._M_current = (Entry *)score;
    local_30._M_current =
         (Entry *)std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>::begin
                            (&this->mEntries);
    local_38 = (Entry *)std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>::end
                                  (&this->mEntries);
    local_40 = id;
    local_28 = std::
               find_if<__gnu_cxx::__normal_iterator<Highscore::Entry*,std::vector<Highscore::Entry,std::allocator<Highscore::Entry>>>,Highscore::Set(unsigned_long,unsigned_long)::_lambda(Highscore::Entry_const&)_1_>
                         (local_30,(__normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
                                    )local_38,(anon_class_8_1_3fcf65d9_for__M_pred)id);
    local_48._M_current =
         (Entry *)std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>::end
                            (&this->mEntries);
    bVar2 = __gnu_cxx::operator==(&local_28,&local_48);
    if (bVar2) {
      local_58._M_current =
           (Entry *)std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>::begin
                              (&this->mEntries);
      local_60 = (Entry *)std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>::end
                                    (&this->mEntries);
      local_68 = it._M_current;
      local_50 = (Entry *)std::
                          find_if<__gnu_cxx::__normal_iterator<Highscore::Entry*,std::vector<Highscore::Entry,std::allocator<Highscore::Entry>>>,Highscore::Set(unsigned_long,unsigned_long)::_lambda(Highscore::Entry_const&)_2_>
                                    (local_58,(__normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
                                               )local_60,it._M_current);
      local_28 = (__normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
                  )local_50;
    }
    local_70._M_current =
         (Entry *)std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>::end
                            (&this->mEntries);
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_70);
    if (bVar2) {
      pEVar3 = __gnu_cxx::
               __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
               ::operator->(&local_28);
      _Var1 = it;
      pEVar3->id = id;
      pEVar3 = __gnu_cxx::
               __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
               ::operator->(&local_28);
      pEVar3->score = (size_t)_Var1._M_current;
      __first = std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>::begin
                          (&this->mEntries);
      __last = std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>::end
                         (&this->mEntries);
      local_78 = std::
                 min_element<__gnu_cxx::__normal_iterator<Highscore::Entry*,std::vector<Highscore::Entry,std::allocator<Highscore::Entry>>>>
                           (__first._M_current,__last._M_current);
      pEVar3 = __gnu_cxx::
               __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
               ::operator->(&local_78);
      this->mLowestScore = pEVar3->score;
    }
  }
  return;
}

Assistant:

void Set( const size_t id, const size_t score ) {
    if( score < mLowestScore )
      return;

    auto it = std::find_if(
      mEntries.begin(), mEntries.end(),
      [id]( const Entry& candidate ) { return id == candidate.id; } );

    if( it == mEntries.end() ) {
      it = std::find_if(
        mEntries.begin(), mEntries.end(),
        [score]( const Entry& candidate ) { return score > candidate.score; } );
    }

    if( it != mEntries.end() ) {
      it->id    = id;
      it->score = score;

      mLowestScore =
        std::min_element( mEntries.begin(), mEntries.end() )->score;
    }
  }